

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

Vec_Ptr_t * Aig_ManMuxesCollect(Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Obj_t *pNode;
  int i;
  
  p = Vec_PtrAlloc(100);
  for (i = 0; i < pAig->vObjs->nSize; i = i + 1) {
    pNode = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,i);
    if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
      iVar1 = Aig_ObjIsMuxType(pNode);
      if (iVar1 != 0) {
        Vec_PtrPush(p,pNode);
      }
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Aig_ManMuxesCollect( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i;
    vMuxes = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) )
            Vec_PtrPush( vMuxes, pObj );
    return vMuxes;
}